

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_catalog.cpp
# Opt level: O0

void __thiscall duckdb::DuckCatalog::~DuckCatalog(DuckCatalog *this)

{
  DuckCatalog *in_RDI;
  
  ~DuckCatalog(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

DuckCatalog::~DuckCatalog() {
}